

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O0

int ifstream_readTextFileFromHandle(ifstream_t *self,FILE *fh)

{
  char *__s;
  uint8_t *__ptr;
  char *pcVar1;
  size_t sVar2;
  int *piVar3;
  size_t local_38;
  size_t len;
  char *chunk;
  char *buf;
  uint32_t chunkLen;
  int retval;
  FILE *fh_local;
  ifstream_t *self_local;
  
  buf._4_4_ = 0;
  if ((self == (ifstream_t *)0x0) || (fh == (FILE *)0x0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    buf._4_4_ = -1;
  }
  else {
    buf._0_4_ = 0;
    __s = (char *)malloc(0x2000);
    __ptr = (uint8_t *)malloc(0x2000);
    if ((__s != (char *)0x0) && (__ptr != (uint8_t *)0x0)) {
      if ((self->handler).open != (_func_void_void_ptr *)0x0) {
        (*(self->handler).open)((self->handler).arg);
      }
      while (pcVar1 = fgets(__s,0x2000,(FILE *)fh), pcVar1 != (char *)0x0) {
        sVar2 = strlen(__s);
        if (sVar2 == 0) {
          __assert_fail("len>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/filestream.c"
                        ,0x95,"int ifstream_readTextFileFromHandle(ifstream_t *, FILE *)");
        }
        local_38 = sVar2;
        if ((1 < sVar2) && (__s[sVar2 - 2] == '\r')) {
          local_38 = sVar2 - 1;
          __s[sVar2 - 2] = '\n';
        }
        if (local_38 + (uint)buf < 0x2000) {
          memcpy(__ptr + (uint)buf,__s,local_38);
          buf._0_4_ = (uint)local_38 + (uint)buf;
        }
        else {
          if ((self->handler).write != (_func_void_void_ptr_uint8_t_ptr_uint32_t *)0x0) {
            (*(self->handler).write)((self->handler).arg,__ptr,(uint)buf);
          }
          memcpy(__ptr,__s,local_38);
          buf._0_4_ = (uint)local_38;
        }
      }
      if (((uint)buf != 0) &&
         ((self->handler).write != (_func_void_void_ptr_uint8_t_ptr_uint32_t *)0x0)) {
        (*(self->handler).write)((self->handler).arg,__ptr,(uint)buf);
      }
      if ((self->handler).close != (_func_void_void_ptr *)0x0) {
        (*(self->handler).close)((self->handler).arg);
      }
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
    if (__ptr != (uint8_t *)0x0) {
      free(__ptr);
    }
  }
  return buf._4_4_;
}

Assistant:

int ifstream_readTextFileFromHandle(ifstream_t *self, FILE *fh)
{
   int retval = 0;
   if( (self != 0) && (fh != 0) ){
      uint32_t chunkLen = 0;
      char *buf;
      char *chunk;
      buf = (char*) malloc(IFSTREAM_BLOCK_SIZE);
      chunk = (char*) malloc(IFSTREAM_BLOCK_SIZE);
      if( (buf != 0) && (chunk != 0) )
      {
         if(self->handler.open != 0)
         {
            self->handler.open(self->handler.arg);
         }

         while(fgets(buf, IFSTREAM_BLOCK_SIZE, fh) != NULL)
         {
            size_t len = strlen(buf);
            assert(len>0);
            //dos2unix file ending
            if( (len>=2) && buf[len-2] == '\r')
            {
               len--;
               buf[len-1]='\n';
            }
            if(len+chunkLen < IFSTREAM_BLOCK_SIZE)
            {
               memcpy(&chunk[chunkLen],buf,len);
               chunkLen += (uint32_t) len;
            }
            else
            {
               if(self->handler.write != 0)
               {
                  self->handler.write(self->handler.arg,(uint8_t*)chunk,chunkLen);
               }
               memcpy(&chunk[0],buf,len);
               chunkLen = (uint32_t) len;
            }
         }
         if( (chunkLen > 0) && (self->handler.write != 0))
         {
            self->handler.write(self->handler.arg,(uint8_t*)chunk,chunkLen);
         }
         if(self->handler.close != 0)
         {
            self->handler.close(self->handler.arg);
         }
      }
      if (buf != 0) free(buf);
      if (chunk != 0) free(chunk);
   }
   else
   {
      errno = EINVAL;
      retval = -1;
   }
   return retval;
}